

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O0

bool __thiscall
MADPComponentFactoredStates::SetInitialized(MADPComponentFactoredStates *this,bool b)

{
  bool bVar1;
  size_t *psVar2;
  reference pvVar3;
  pointer puVar4;
  byte in_SIL;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  Index i;
  MADPComponentFactoredStates *in_stack_00000078;
  FSDist_COF *in_stack_00000080;
  size_type in_stack_ffffffffffffffc8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd8;
  uint local_18;
  
  bVar1 = (bool)(in_SIL & 1);
  if (bVar1 == true) {
    if (((ulong)(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish & 1) != 0) {
      return true;
    }
    psVar2 = IndexTools::CalculateStepSize(in_stack_ffffffffffffffd8);
    in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = psVar2;
    (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
    for (local_18 = 0;
        (pointer)(ulong)local_18 <
        in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start; local_18 = local_18 + 1) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         (in_RDI,in_stack_ffffffffffffffc8);
      (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(*pvVar3 *
                    (long)(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    puVar4 = (pointer)operator_new(0x48);
    FSDist_COF::FSDist_COF(in_stack_00000080,in_stack_00000078);
    in_RDI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar4;
  }
  *(bool *)&(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = bVar1;
  return bVar1;
}

Assistant:

bool MADPComponentFactoredStates::SetInitialized(bool b)
{

    if(b == true)
    {
        if(_m_initialized)
            //already initialized: just return
            return true;

        _m_stepSize = IndexTools::CalculateStepSize(_m_sfacDomainSizes);
        _m_nrStates = 1;
        for(Index i=0;i<_m_nrStateFactors;i++)
            _m_nrStates *= _m_sfacDomainSizes.at(i);



        _m_initialStateDistribution = new FSDist_COF(*this);

#if 0 && DEBUG_MCFS
        PrintDebugStuff();
#endif    

    }
    
    _m_initialized = b;
    return b;
}